

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_formparse.c
# Opt level: O2

char * get_param_word(OperationConfig *config,char **str,char **end_pos,char endchar)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char cVar8;
  
  pcVar6 = *str;
  cVar8 = *pcVar6;
  pcVar2 = pcVar6;
  if (cVar8 == '\"') {
    pcVar5 = pcVar6 + 1;
    pcVar4 = (char *)0x0;
    pcVar7 = pcVar5;
LAB_0010e767:
    do {
      cVar1 = *pcVar7;
      if (cVar1 == '\\') {
        if ((pcVar7[1] == '\\') || (pcVar7[1] == '\"')) {
          if (pcVar4 == (char *)0x0) {
            pcVar4 = pcVar7;
          }
          pcVar7 = pcVar7 + 2;
          goto LAB_0010e767;
        }
      }
      else {
        if (cVar1 == '\0') break;
        if (cVar1 == '\"') goto LAB_0010e7c8;
      }
      pcVar7 = pcVar7 + 1;
    } while( true );
  }
  while (((pcVar7 = pcVar2, cVar8 != '\0' && (cVar8 != ';')) && (cVar8 != endchar))) {
    pcVar2 = pcVar7 + 1;
    cVar8 = pcVar7[1];
  }
  *end_pos = pcVar7;
  pcVar5 = pcVar6;
LAB_0010e853:
  *str = pcVar7;
  return pcVar5;
LAB_0010e7c8:
  *end_pos = pcVar7;
  pcVar6 = pcVar4;
  if (pcVar4 != (char *)0x0) {
    do {
      cVar8 = *pcVar6;
      if ((*pcVar6 == '\\') && ((cVar1 = pcVar6[1], cVar1 == '\\' || (cVar8 = '\\', cVar1 == '\"')))
         ) {
        pcVar6 = pcVar6 + 1;
        cVar8 = cVar1;
      }
      pcVar7 = pcVar6 + 1;
      *pcVar4 = cVar8;
      pcVar4 = pcVar4 + 1;
      pcVar6 = pcVar7;
    } while (pcVar7 < *end_pos);
    *end_pos = pcVar4;
  }
  bVar3 = false;
  while( true ) {
    pcVar7 = pcVar7 + 1;
    cVar8 = *pcVar7;
    if (((cVar8 == '\0') || (cVar8 == ';')) || (cVar8 == endchar)) break;
    if ((cVar8 != ' ') && (cVar8 != '\t')) {
      bVar3 = (bool)(bVar3 | (byte)(cVar8 - 0xeU) < 0xfc);
    }
  }
  if (bVar3) {
    warnf(config->global,"Trailing data after quoted form parameter");
  }
  goto LAB_0010e853;
}

Assistant:

static char *get_param_word(struct OperationConfig *config, char **str,
                            char **end_pos, char endchar)
{
  char *ptr = *str;
  /* the first non-space char is here */
  char *word_begin = ptr;
  char *ptr2;
  char *escape = NULL;

  if(*ptr == '"') {
    ++ptr;
    while(*ptr) {
      if(*ptr == '\\') {
        if(ptr[1] == '\\' || ptr[1] == '"') {
          /* remember the first escape position */
          if(!escape)
            escape = ptr;
          /* skip escape of back-slash or double-quote */
          ptr += 2;
          continue;
        }
      }
      if(*ptr == '"') {
        bool trailing_data = FALSE;
        *end_pos = ptr;
        if(escape) {
          /* has escape, we restore the unescaped string here */
          ptr = ptr2 = escape;
          do {
            if(*ptr == '\\' && (ptr[1] == '\\' || ptr[1] == '"'))
              ++ptr;
            *ptr2++ = *ptr++;
          }
          while(ptr < *end_pos);
          *end_pos = ptr2;
        }
        ++ptr;
        while(*ptr && *ptr != ';' && *ptr != endchar) {
          if(!ISSPACE(*ptr))
            trailing_data = TRUE;
          ++ptr;
        }
        if(trailing_data)
          warnf(config->global, "Trailing data after quoted form parameter");
        *str = ptr;
        return word_begin + 1;
      }
      ++ptr;
    }
    /* end quote is missing, treat it as non-quoted. */
    ptr = word_begin;
  }

  while(*ptr && *ptr != ';' && *ptr != endchar)
    ++ptr;
  *str = *end_pos = ptr;
  return word_begin;
}